

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void canvas_finderror(void *error_object)

{
  int iVar1;
  _glist *gl;
  
  gl = pd_getcanvaslist();
  while( true ) {
    if (gl == (_glist *)0x0) {
      pd_error((void *)0x0,"... sorry, I couldn\'t find the source of that error.");
      return;
    }
    iVar1 = glist_dofinderror(gl,error_object);
    if (iVar1 != 0) break;
    gl = gl->gl_next;
  }
  return;
}

Assistant:

void canvas_finderror(const void *error_object)
{
    t_canvas *x;
        /* find all root canvases */
    for (x = pd_getcanvaslist(); x; x = x->gl_next)
    {
        if (glist_dofinderror(x, error_object))
            return;
    }
    pd_error(0, "... sorry, I couldn't find the source of that error.");
}